

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O1

void __thiscall
kj::_::
Fiber<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++:1473:7)>
::runImpl(Fiber<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_test_c__:1473:7)>
          *this,WaitScope *waitScope)

{
  int i;
  __pid_t local_1fc;
  char *local_1f8;
  char *pcStack_1f0;
  undefined8 local_1e8;
  DebugComparison<int_&,_int> local_1e0;
  ExceptionOr<kj::StringPtr> local_1b8;
  
  local_1f8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++"
  ;
  pcStack_1f0 = "operator()";
  local_1e8 = 0xd000005c2;
  local_1fc = Promise<int>::wait(&(this->func).promise,waitScope);
  local_1e0.left = &local_1fc;
  local_1e0.right = 0x7b;
  local_1e0.op.content.ptr = " == ";
  local_1e0.op.content.size_ = 5;
  local_1e0.result = local_1fc == 0x7b;
  if ((!local_1e0.result) && (Debug::minSeverity < 3)) {
    Debug::log<char_const(&)[26],kj::_::DebugComparison<int&,int>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++"
               ,0x5c3,ERROR,"\"failed: expected \" \"i == 123\", _kjCondition",
               (char (*) [26])"failed: expected i == 123",&local_1e0);
  }
  local_1b8.super_ExceptionOrValue.exception.ptr.isSet = false;
  local_1b8.value.ptr.isSet = true;
  local_1b8.value.ptr.field_1.value.content.ptr = "foo";
  local_1b8.value.ptr.field_1.value.content.size_ = 4;
  ExceptionOr<kj::StringPtr>::operator=(&this->result,&local_1b8);
  if (local_1b8.super_ExceptionOrValue.exception.ptr.isSet == true) {
    Exception::~Exception(&local_1b8.super_ExceptionOrValue.exception.ptr.field_1.value);
  }
  return;
}

Assistant:

void runImpl(WaitScope& waitScope) override {
    result.template as<ResultType>() =
        MaybeVoidCaller<WaitScope&, ResultType>::apply(func, waitScope);
  }